

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

QString * __thiscall QWidgetLineControl::text(QWidgetLineControl *this)

{
  long lVar1;
  bool bVar2;
  QByteArrayView *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString res;
  QString content;
  QString *in_stack_ffffffffffffff88;
  QString *data;
  QString *str;
  QWidgetLineControl *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  str = in_RDI;
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)0x5cbfae);
  if (bVar2) {
    stripString(in_stack_ffffffffffffffb8,str);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffff88);
  }
  bVar2 = QString::isNull((QString *)0x5cbfe3);
  if (bVar2) {
    QByteArrayView::QByteArrayView<1ul>(in_RSI,(char (*) [1])data);
    QVar3.m_data = (storage_type *)in_stack_ffffffffffffffb8;
    QVar3.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar3);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffff88);
  }
  QString::~QString((QString *)0x5cc029);
  QString::~QString((QString *)0x5cc033);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

QString text() const
    {
        QString content = m_text;
        QString res = m_maskData ? stripString(content) : content;
        return (res.isNull() ? QString::fromLatin1("") : res);
    }